

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::JoinHashTable::ScanStructure::Next
          (ScanStructure *this,DataChunk *keys,DataChunk *left,DataChunk *result)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->finished == false) {
    switch(this->ht->join_type) {
    case LEFT:
    case OUTER:
      NextLeftJoin(this,keys,left,result);
      return;
    case RIGHT:
    case INNER:
      NextInnerJoin(this,keys,left,result);
      return;
    case SEMI:
      NextSemiJoin(this,keys,left,result);
      return;
    case ANTI:
      NextAntiJoin(this,keys,left,result);
      return;
    case MARK:
      NextMarkJoin(this,keys,left,result);
      return;
    case SINGLE:
      NextSingleJoin(this,keys,left,result);
      return;
    case RIGHT_SEMI:
    case RIGHT_ANTI:
      NextRightSemiOrAntiJoin(this,keys);
      return;
    default:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Unhandled join type in JoinHashTable",&local_39);
      InternalException::InternalException(this_00,&local_38);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void ScanStructure::Next(DataChunk &keys, DataChunk &left, DataChunk &result) {
	D_ASSERT(keys.size() == left.size());
	if (finished) {
		return;
	}
	switch (ht.join_type) {
	case JoinType::INNER:
	case JoinType::RIGHT:
		NextInnerJoin(keys, left, result);
		break;
	case JoinType::SEMI:
		NextSemiJoin(keys, left, result);
		break;
	case JoinType::MARK:
		NextMarkJoin(keys, left, result);
		break;
	case JoinType::ANTI:
		NextAntiJoin(keys, left, result);
		break;
	case JoinType::RIGHT_ANTI:
	case JoinType::RIGHT_SEMI:
		NextRightSemiOrAntiJoin(keys);
		break;
	case JoinType::OUTER:
	case JoinType::LEFT:
		NextLeftJoin(keys, left, result);
		break;
	case JoinType::SINGLE:
		NextSingleJoin(keys, left, result);
		break;
	default:
		throw InternalException("Unhandled join type in JoinHashTable");
	}
}